

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O3

void __thiscall cmCTestHG::cmCTestHG(cmCTestHG *this,cmCTest *ct,ostream *log)

{
  cmCTestGlobalVC::cmCTestGlobalVC(&this->super_cmCTestGlobalVC,ct,log);
  (this->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC =
       (_func_int **)&PTR__cmCTestHG_00b17c30;
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.Date);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.Author);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.EMail);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.Committer);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.CommitterEMail);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.CommitDate);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.Log);
  return;
}

Assistant:

cmCTestHG::cmCTestHG(cmCTest* ct, std::ostream& log)
  : cmCTestGlobalVC(ct, log)
{
  this->PriorRev = this->Unknown;
}